

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_access(void)

{
  undefined8 uVar1;
  ssize_t sVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  __uid_t _Var4;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  void *pvVar7;
  uv_file uVar8;
  uv_loop_t *puVar9;
  uv_loop_t *puVar10;
  uv_fs_t *puVar11;
  uv_fs_t *puVar12;
  uv_fs_t *puVar13;
  char *loop;
  uv_fs_t *unaff_R14;
  uv_fs_t *req_00;
  uv_fs_t *puVar14;
  uv_buf_t uVar15;
  uv_fs_t req;
  uv_fs_t uStackY_ce0;
  uv_loop_t *puStackY_b28;
  code *pcStackY_b20;
  undefined1 auStack_b08 [576];
  uv_loop_t *puStack_8c8;
  uv_loop_t *puStack_768;
  uv_fs_t *puStack_760;
  undefined1 auStack_748 [568];
  void *pvStack_510;
  uint uStack_4f0;
  uv_loop_t *puStack_3b0;
  uv_fs_t uStack_3a0;
  uv_loop_t *puStack_1e8;
  uv_fs_t *puStack_1e0;
  uv_loop_t *local_170;
  
  req_00 = (uv_fs_t *)&stack0xfffffffffffffe38;
  puVar5 = (uv_loop_t *)&stack0xfffffffffffffe38;
  puVar9 = (uv_loop_t *)0x194385;
  unlink("test_file");
  rmdir("test_dir");
  ::loop = uv_default_loop();
  puVar6 = (uv_loop_t *)0x0;
  iVar3 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe38,"test_file",0,
                       (uv_fs_cb)0x0);
  if (iVar3 < 0) {
    if (-1 < (long)local_170) goto LAB_00152720;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe38);
    puVar6 = ::loop;
    iVar3 = uv_fs_access(::loop,(uv_fs_t *)&stack0xfffffffffffffe38,"test_file",0,access_cb);
    puVar9 = (uv_loop_t *)&stack0xfffffffffffffe38;
    if (iVar3 != 0) goto LAB_00152725;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar9 = (uv_loop_t *)&stack0xfffffffffffffe38;
    if (access_cb_count != 1) goto LAB_0015272a;
    access_cb_count = 0;
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe38,"test_file",0x42,0x180,
                       (uv_fs_cb)0x0);
    puVar10 = local_170;
    puVar9 = (uv_loop_t *)&stack0xfffffffffffffe38;
    if (iVar3 < 0) goto LAB_0015272f;
    if ((long)local_170 < 0) goto LAB_00152734;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe38);
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe38,"test_file",0,
                         (uv_fs_cb)0x0);
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe38;
    if (iVar3 != 0) goto LAB_00152739;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe38;
    if (local_170 != (uv_loop_t *)0x0) goto LAB_0015273e;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe38);
    puVar6 = ::loop;
    iVar3 = uv_fs_access(::loop,(uv_fs_t *)&stack0xfffffffffffffe38,"test_file",0,access_cb);
    if (iVar3 != 0) goto LAB_00152743;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe38;
    if (access_cb_count != 1) goto LAB_00152748;
    access_cb_count = 0;
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe38,(uv_file)puVar10,
                        (uv_fs_cb)0x0);
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe38;
    if (iVar3 != 0) goto LAB_0015274d;
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe38;
    if (local_170 != (uv_loop_t *)0x0) goto LAB_00152752;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe38);
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe38,"test_dir",0x1ff,
                        (uv_fs_cb)0x0);
    puVar10 = (uv_loop_t *)&stack0xfffffffffffffe38;
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe38;
    if (iVar3 != 0) goto LAB_00152757;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe38);
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe38,"test_dir",2,
                         (uv_fs_cb)0x0);
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe38;
    if (iVar3 != 0) goto LAB_0015275c;
    puVar5 = (uv_loop_t *)&stack0xfffffffffffffe38;
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe38;
    if (local_170 != (uv_loop_t *)0x0) goto LAB_00152761;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe38);
    uv_run(::loop,UV_RUN_DEFAULT);
    unlink("test_file");
    rmdir("test_dir");
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar6 = uv_default_loop();
    iVar3 = uv_loop_close(puVar6);
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe38;
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_00152720:
    run_test_fs_access_cold_2();
LAB_00152725:
    run_test_fs_access_cold_3();
LAB_0015272a:
    run_test_fs_access_cold_4();
LAB_0015272f:
    puVar10 = puVar9;
    run_test_fs_access_cold_5();
LAB_00152734:
    run_test_fs_access_cold_6();
LAB_00152739:
    run_test_fs_access_cold_7();
LAB_0015273e:
    req_00 = unaff_R14;
    run_test_fs_access_cold_8();
LAB_00152743:
    run_test_fs_access_cold_9();
LAB_00152748:
    run_test_fs_access_cold_10();
LAB_0015274d:
    run_test_fs_access_cold_11();
LAB_00152752:
    run_test_fs_access_cold_12();
LAB_00152757:
    puVar5 = puVar10;
    run_test_fs_access_cold_13();
LAB_0015275c:
    run_test_fs_access_cold_14();
LAB_00152761:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar6->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    uv_fs_req_cleanup((uv_fs_t *)puVar6);
    return extraout_EAX;
  }
  access_cb_cold_1();
  puVar9 = (uv_loop_t *)0x194385;
  puStack_3b0 = (uv_loop_t *)0x15279d;
  puStack_1e8 = puVar5;
  puStack_1e0 = req_00;
  unlink("test_file");
  puStack_3b0 = (uv_loop_t *)0x1527a2;
  ::loop = uv_default_loop();
  puVar12 = &uStack_3a0;
  puVar5 = (uv_loop_t *)0x0;
  puStack_3b0 = (uv_loop_t *)0x1527c6;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,puVar12,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar2 = uStack_3a0.result;
  if (iVar3 < 0) {
    puStack_3b0 = (uv_loop_t *)0x152a99;
    run_test_fs_chmod_cold_1();
LAB_00152a99:
    puStack_3b0 = (uv_loop_t *)0x152a9e;
    run_test_fs_chmod_cold_2();
LAB_00152a9e:
    puStack_3b0 = (uv_loop_t *)0x152aa3;
    run_test_fs_chmod_cold_3();
LAB_00152aa3:
    puStack_3b0 = (uv_loop_t *)0x152aa8;
    run_test_fs_chmod_cold_4();
LAB_00152aa8:
    puStack_3b0 = (uv_loop_t *)0x152aad;
    run_test_fs_chmod_cold_5();
LAB_00152aad:
    puStack_3b0 = (uv_loop_t *)0x152ab2;
    run_test_fs_chmod_cold_6();
LAB_00152ab2:
    puStack_3b0 = (uv_loop_t *)0x152ab7;
    run_test_fs_chmod_cold_7();
LAB_00152ab7:
    puStack_3b0 = (uv_loop_t *)0x152abc;
    run_test_fs_chmod_cold_8();
LAB_00152abc:
    puStack_3b0 = (uv_loop_t *)0x152ac1;
    run_test_fs_chmod_cold_9();
LAB_00152ac1:
    puStack_3b0 = (uv_loop_t *)0x152ac6;
    run_test_fs_chmod_cold_10();
LAB_00152ac6:
    puStack_3b0 = (uv_loop_t *)0x152acb;
    run_test_fs_chmod_cold_11();
LAB_00152acb:
    puStack_3b0 = (uv_loop_t *)0x152ad0;
    run_test_fs_chmod_cold_12();
LAB_00152ad0:
    puStack_3b0 = (uv_loop_t *)0x152ad5;
    run_test_fs_chmod_cold_13();
LAB_00152ad5:
    puStack_3b0 = (uv_loop_t *)0x152ada;
    run_test_fs_chmod_cold_14();
LAB_00152ada:
    puStack_3b0 = (uv_loop_t *)0x152adf;
    run_test_fs_chmod_cold_15();
LAB_00152adf:
    puStack_3b0 = (uv_loop_t *)0x152ae4;
    run_test_fs_chmod_cold_16();
  }
  else {
    puVar9 = (uv_loop_t *)uStack_3a0.result;
    if (uStack_3a0.result < 0) goto LAB_00152a99;
    req_00 = &uStack_3a0;
    puStack_3b0 = (uv_loop_t *)0x1527e9;
    uv_fs_req_cleanup(req_00);
    puStack_3b0 = (uv_loop_t *)0x1527fa;
    iov = uv_buf_init(test_buf,0xd);
    puVar5 = (uv_loop_t *)0x0;
    uVar8 = (uv_file)sVar2;
    puStack_3b0 = (uv_loop_t *)0x152830;
    puVar12 = req_00;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,req_00,uVar8,&iov,1,-1,(uv_fs_cb)0x0);
    puVar9 = (uv_loop_t *)sVar2;
    if (iVar3 != 0xd) goto LAB_00152a9e;
    if ((uv_loop_t *)uStack_3a0.result != (uv_loop_t *)0xd) goto LAB_00152aa3;
    req_00 = &uStack_3a0;
    puStack_3b0 = (uv_loop_t *)0x152852;
    uv_fs_req_cleanup(req_00);
    puVar5 = (uv_loop_t *)0x0;
    puStack_3b0 = (uv_loop_t *)0x15286b;
    puVar12 = req_00;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req_00,"test_file",0x80,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152aa8;
    if ((uv_loop_t *)uStack_3a0.result != (uv_loop_t *)0x0) goto LAB_00152aad;
    req_00 = &uStack_3a0;
    puStack_3b0 = (uv_loop_t *)0x15288c;
    uv_fs_req_cleanup(req_00);
    puStack_3b0 = (uv_loop_t *)0x1528a0;
    check_permission("test_file",0x80);
    puVar5 = (uv_loop_t *)0x0;
    puStack_3b0 = (uv_loop_t *)0x1528b5;
    puVar12 = req_00;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req_00,"test_file",0x100,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152ab2;
    if ((uv_loop_t *)uStack_3a0.result != (uv_loop_t *)0x0) goto LAB_00152ab7;
    req_00 = &uStack_3a0;
    puStack_3b0 = (uv_loop_t *)0x1528d6;
    uv_fs_req_cleanup(req_00);
    puStack_3b0 = (uv_loop_t *)0x1528e7;
    check_permission("test_file",0x100);
    puVar5 = (uv_loop_t *)0x0;
    puStack_3b0 = (uv_loop_t *)0x1528fb;
    puVar12 = req_00;
    iVar3 = uv_fs_fchmod((uv_loop_t *)0x0,req_00,uVar8,0x180,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152abc;
    if ((uv_loop_t *)uStack_3a0.result != (uv_loop_t *)0x0) goto LAB_00152ac1;
    req_00 = &uStack_3a0;
    puStack_3b0 = (uv_loop_t *)0x15291c;
    uv_fs_req_cleanup(req_00);
    puStack_3b0 = (uv_loop_t *)0x152930;
    check_permission("test_file",0x180);
    uStack_3a0.data = &run_test_fs_chmod::mode;
    puStack_3b0 = (uv_loop_t *)0x152958;
    puVar12 = req_00;
    puVar5 = ::loop;
    iVar3 = uv_fs_chmod(::loop,req_00,"test_file",0x80,chmod_cb);
    if (iVar3 != 0) goto LAB_00152ac6;
    puVar12 = (uv_fs_t *)0x0;
    puStack_3b0 = (uv_loop_t *)0x15296e;
    puVar5 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (chmod_cb_count != 1) goto LAB_00152acb;
    chmod_cb_count = 0;
    puVar12 = &uStack_3a0;
    uStack_3a0.data = &run_test_fs_chmod::mode_1;
    puStack_3b0 = (uv_loop_t *)0x1529b3;
    puVar5 = ::loop;
    iVar3 = uv_fs_chmod(::loop,puVar12,"test_file",0x100,chmod_cb);
    if (iVar3 != 0) goto LAB_00152ad0;
    puVar12 = (uv_fs_t *)0x0;
    puStack_3b0 = (uv_loop_t *)0x1529c9;
    puVar5 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (chmod_cb_count != 1) goto LAB_00152ad5;
    puVar12 = &uStack_3a0;
    uStack_3a0.data = &run_test_fs_chmod::mode_2;
    puStack_3b0 = (uv_loop_t *)0x1529ff;
    puVar5 = ::loop;
    iVar3 = uv_fs_fchmod(::loop,puVar12,uVar8,0x180,fchmod_cb);
    if (iVar3 != 0) goto LAB_00152ada;
    puVar12 = (uv_fs_t *)0x0;
    puStack_3b0 = (uv_loop_t *)0x152a15;
    puVar5 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (fchmod_cb_count != 1) goto LAB_00152adf;
    puStack_3b0 = (uv_loop_t *)0x152a37;
    uv_fs_close(::loop,&uStack_3a0,uVar8,(uv_fs_cb)0x0);
    puStack_3b0 = (uv_loop_t *)0x152a45;
    uv_run(::loop,UV_RUN_DEFAULT);
    puStack_3b0 = (uv_loop_t *)0x152a51;
    unlink("test_file");
    puStack_3b0 = (uv_loop_t *)0x152a56;
    puVar9 = uv_default_loop();
    puStack_3b0 = (uv_loop_t *)0x152a6a;
    uv_walk(puVar9,close_walk_cb,(void *)0x0);
    puVar12 = (uv_fs_t *)0x0;
    puStack_3b0 = (uv_loop_t *)0x152a74;
    uv_run(puVar9,UV_RUN_DEFAULT);
    puStack_3b0 = (uv_loop_t *)0x152a79;
    puVar5 = uv_default_loop();
    puStack_3b0 = (uv_loop_t *)0x152a81;
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      return 0;
    }
  }
  puStack_3b0 = (uv_loop_t *)check_permission;
  run_test_fs_chmod_cold_17();
  puVar11 = (uv_fs_t *)((ulong)puVar12 & 0xffffffff);
  puVar13 = (uv_fs_t *)0x0;
  auStack_748._464_8_ = (void *)0x152b04;
  puStack_3b0 = puVar9;
  iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)(auStack_748 + 0x1e0),(char *)puVar5,(uv_fs_cb)0x0)
  ;
  if (iVar3 == 0) {
    if (pvStack_510 != (void *)0x0) goto LAB_00152b38;
    if ((uStack_4f0 & 0x1ff) == (uint)puVar12) {
      auStack_748._464_8_ = (void *)0x152b2a;
      uv_fs_req_cleanup((uv_fs_t *)(auStack_748 + 0x1e0));
      return extraout_EAX_00;
    }
  }
  else {
    auStack_748._464_8_ = (void *)0x152b38;
    check_permission_cold_1();
LAB_00152b38:
    auStack_748._464_8_ = (void *)0x152b3d;
    check_permission_cold_2();
  }
  auStack_748._464_8_ = chmod_cb;
  check_permission_cold_3();
  auStack_748._464_8_ = puVar11;
  if (puVar13->fs_type == UV_FS_CHMOD) {
    puVar11 = puVar13;
    if (puVar13->result == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      auStack_748._456_8_ = (uv__io_cb)0x152b61;
      uv_fs_req_cleanup(puVar13);
      check_permission("test_file",*puVar13->data);
      return extraout_EAX_01;
    }
  }
  else {
    auStack_748._456_8_ = (uv__io_cb)0x152b78;
    chmod_cb_cold_1();
  }
  auStack_748._456_8_ = fchmod_cb;
  chmod_cb_cold_2();
  auStack_748._456_8_ = puVar11;
  if (puVar13->fs_type == UV_FS_FCHMOD) {
    auStack_748._440_8_ = puVar13;
    if (puVar13->result == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      auStack_748._448_8_ = (_func_void *)0x152b9c;
      uv_fs_req_cleanup(puVar13);
      check_permission("test_file",*puVar13->data);
      return extraout_EAX_02;
    }
  }
  else {
    auStack_748._448_8_ = (_func_void *)0x152bb3;
    fchmod_cb_cold_1();
    auStack_748._440_8_ = puVar11;
  }
  auStack_748._448_8_ = run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  puVar5 = (uv_loop_t *)0x194385;
  puStack_760 = (uv_fs_t *)0x152bd1;
  auStack_748._448_8_ = req_00;
  unlink("test_file");
  puStack_760 = (uv_fs_t *)0x152bd6;
  ::loop = uv_default_loop();
  puStack_760 = (uv_fs_t *)0x152bfa;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_748,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_748._88_8_;
  if (iVar3 < 0) {
    puStack_760 = (uv_fs_t *)0x152d97;
    run_test_fs_unlink_readonly_cold_1();
LAB_00152d97:
    puStack_760 = (uv_fs_t *)0x152d9c;
    run_test_fs_unlink_readonly_cold_2();
LAB_00152d9c:
    puStack_760 = (uv_fs_t *)0x152da1;
    run_test_fs_unlink_readonly_cold_3();
LAB_00152da1:
    puStack_760 = (uv_fs_t *)0x152da6;
    run_test_fs_unlink_readonly_cold_4();
LAB_00152da6:
    puStack_760 = (uv_fs_t *)0x152dab;
    run_test_fs_unlink_readonly_cold_5();
LAB_00152dab:
    puStack_760 = (uv_fs_t *)0x152db0;
    run_test_fs_unlink_readonly_cold_6();
LAB_00152db0:
    puStack_760 = (uv_fs_t *)0x152db5;
    run_test_fs_unlink_readonly_cold_7();
LAB_00152db5:
    puStack_760 = (uv_fs_t *)0x152dba;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    puVar5 = (uv_loop_t *)auStack_748._88_8_;
    if ((long)auStack_748._88_8_ < 0) goto LAB_00152d97;
    req_00 = (uv_fs_t *)auStack_748;
    puStack_760 = (uv_fs_t *)0x152c1d;
    uv_fs_req_cleanup(req_00);
    puStack_760 = (uv_fs_t *)0x152c2e;
    uVar15 = uv_buf_init(test_buf,0xd);
    puStack_760 = (uv_fs_t *)0x152c64;
    iov = uVar15;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,req_00,(uv_file)uVar1,&iov,1,-1,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)uVar1;
    if (iVar3 != 0xd) goto LAB_00152d9c;
    if ((uv_loop_t *)auStack_748._88_8_ != (uv_loop_t *)0xd) goto LAB_00152da1;
    req_00 = (uv_fs_t *)auStack_748;
    puStack_760 = (uv_fs_t *)0x152c86;
    uv_fs_req_cleanup(req_00);
    puStack_760 = (uv_fs_t *)0x152c99;
    uv_fs_close(::loop,req_00,(uv_file)uVar1,(uv_fs_cb)0x0);
    puStack_760 = (uv_fs_t *)0x152cb2;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req_00,"test_file",0x100,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152da6;
    if ((uv_loop_t *)auStack_748._88_8_ != (uv_loop_t *)0x0) goto LAB_00152dab;
    puVar5 = (uv_loop_t *)auStack_748;
    puStack_760 = (uv_fs_t *)0x152cd3;
    uv_fs_req_cleanup((uv_fs_t *)puVar5);
    req_00 = (uv_fs_t *)0x194385;
    puStack_760 = (uv_fs_t *)0x152ce7;
    check_permission("test_file",0x100);
    puStack_760 = (uv_fs_t *)0x152cf6;
    iVar3 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)puVar5,"test_file",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152db0;
    if ((uv_loop_t *)auStack_748._88_8_ != (uv_loop_t *)0x0) goto LAB_00152db5;
    puStack_760 = (uv_fs_t *)0x152d17;
    uv_fs_req_cleanup((uv_fs_t *)auStack_748);
    puStack_760 = (uv_fs_t *)0x152d25;
    uv_run(::loop,UV_RUN_DEFAULT);
    req_00 = (uv_fs_t *)0x194385;
    puStack_760 = (uv_fs_t *)0x152d41;
    uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)auStack_748,"test_file",0x180,(uv_fs_cb)0x0);
    puStack_760 = (uv_fs_t *)0x152d49;
    uv_fs_req_cleanup((uv_fs_t *)auStack_748);
    puStack_760 = (uv_fs_t *)0x152d51;
    unlink("test_file");
    puStack_760 = (uv_fs_t *)0x152d56;
    puVar5 = uv_default_loop();
    puStack_760 = (uv_fs_t *)0x152d6a;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_760 = (uv_fs_t *)0x152d74;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_760 = (uv_fs_t *)0x152d79;
    puVar9 = uv_default_loop();
    puStack_760 = (uv_fs_t *)0x152d81;
    iVar3 = uv_loop_close(puVar9);
    if (iVar3 == 0) {
      return 0;
    }
  }
  puStack_760 = (uv_fs_t *)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  puVar14 = (uv_fs_t *)(auStack_b08 + 0x1e8);
  puVar13 = (uv_fs_t *)(auStack_b08 + 0x1e8);
  puVar11 = (uv_fs_t *)(auStack_b08 + 0x1e8);
  puVar12 = (uv_fs_t *)(auStack_b08 + 0x1e8);
  puVar9 = (uv_loop_t *)0x194385;
  auStack_b08._480_8_ = (void *)0x152dd8;
  puStack_768 = puVar5;
  puStack_760 = req_00;
  unlink("test_file");
  auStack_b08._480_8_ = (void *)0x152de4;
  unlink("test_file_link");
  auStack_b08._480_8_ = (void *)0x152de9;
  ::loop = uv_default_loop();
  puVar6 = (uv_loop_t *)0x0;
  auStack_b08._480_8_ = (void *)0x152e0b;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b08 + 0x1e8),"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  puVar5 = puStack_8c8;
  if (iVar3 < 0) {
    auStack_b08._480_8_ = (void *)0x1530dc;
    run_test_fs_chown_cold_1();
LAB_001530dc:
    auStack_b08._480_8_ = (void *)0x1530e1;
    run_test_fs_chown_cold_2();
LAB_001530e1:
    auStack_b08._480_8_ = (void *)0x1530e6;
    run_test_fs_chown_cold_3();
LAB_001530e6:
    puVar14 = req_00;
    auStack_b08._480_8_ = (void *)0x1530eb;
    run_test_fs_chown_cold_4();
LAB_001530eb:
    auStack_b08._480_8_ = (void *)0x1530f0;
    run_test_fs_chown_cold_5();
LAB_001530f0:
    puVar13 = puVar14;
    auStack_b08._480_8_ = (void *)0x1530f5;
    run_test_fs_chown_cold_6();
LAB_001530f5:
    auStack_b08._480_8_ = (void *)0x1530fa;
    run_test_fs_chown_cold_7();
LAB_001530fa:
    auStack_b08._480_8_ = (void *)0x1530ff;
    run_test_fs_chown_cold_8();
LAB_001530ff:
    auStack_b08._480_8_ = (void *)0x153104;
    run_test_fs_chown_cold_9();
LAB_00153104:
    auStack_b08._480_8_ = (void *)0x153109;
    run_test_fs_chown_cold_10();
LAB_00153109:
    auStack_b08._480_8_ = (void *)0x15310e;
    run_test_fs_chown_cold_11();
LAB_0015310e:
    auStack_b08._480_8_ = (void *)0x153113;
    run_test_fs_chown_cold_12();
LAB_00153113:
    auStack_b08._480_8_ = (void *)0x153118;
    run_test_fs_chown_cold_13();
LAB_00153118:
    puVar11 = puVar13;
    auStack_b08._480_8_ = (void *)0x15311d;
    run_test_fs_chown_cold_14();
LAB_0015311d:
    auStack_b08._480_8_ = (void *)0x153122;
    run_test_fs_chown_cold_15();
LAB_00153122:
    puVar12 = puVar11;
    auStack_b08._480_8_ = (void *)0x153127;
    run_test_fs_chown_cold_16();
LAB_00153127:
    auStack_b08._480_8_ = (void *)0x15312c;
    run_test_fs_chown_cold_17();
LAB_0015312c:
    auStack_b08._480_8_ = (void *)0x153131;
    run_test_fs_chown_cold_18();
LAB_00153131:
    auStack_b08._480_8_ = (void *)0x153136;
    run_test_fs_chown_cold_19();
LAB_00153136:
    auStack_b08._480_8_ = (void *)0x15313b;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar9 = puStack_8c8;
    if ((long)puStack_8c8 < 0) goto LAB_001530dc;
    auStack_b08._480_8_ = (void *)0x152e2c;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b08 + 0x1e8));
    puVar6 = (uv_loop_t *)0x0;
    auStack_b08._480_8_ = (void *)0x152e4b;
    iVar3 = uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b08 + 0x1e8),"test_file",0xffffffff,
                        0xffffffff,(uv_fs_cb)0x0);
    puVar9 = puVar5;
    req_00 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (iVar3 != 0) goto LAB_001530e1;
    req_00 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (puStack_8c8 != (uv_loop_t *)0x0) goto LAB_001530e6;
    auStack_b08._480_8_ = (void *)0x152e6a;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b08 + 0x1e8));
    puVar6 = (uv_loop_t *)0x0;
    uVar8 = (uv_file)puVar5;
    auStack_b08._480_8_ = (void *)0x152e84;
    iVar3 = uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b08 + 0x1e8),uVar8,0xffffffff,
                         0xffffffff,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001530eb;
    puVar14 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (puStack_8c8 != (uv_loop_t *)0x0) goto LAB_001530f0;
    auStack_b08._480_8_ = (void *)0x152ea3;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b08 + 0x1e8));
    auStack_b08._480_8_ = (void *)0x152ecb;
    puVar6 = ::loop;
    iVar3 = uv_fs_chown(::loop,(uv_fs_t *)(auStack_b08 + 0x1e8),"test_file",0xffffffff,0xffffffff,
                        chown_cb);
    if (iVar3 != 0) goto LAB_001530f5;
    auStack_b08._480_8_ = (void *)0x152ee1;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar13 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_001530fa;
    chown_cb_count = 0;
    auStack_b08._480_8_ = (void *)0x152f1a;
    puVar6 = ::loop;
    iVar3 = uv_fs_chown(::loop,(uv_fs_t *)(auStack_b08 + 0x1e8),"test_file",0,0,chown_root_cb);
    puVar13 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (iVar3 != 0) goto LAB_001530ff;
    auStack_b08._480_8_ = (void *)0x152f30;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar13 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_00153104;
    auStack_b08._480_8_ = (void *)0x152f60;
    puVar6 = ::loop;
    iVar3 = uv_fs_fchown(::loop,(uv_fs_t *)(auStack_b08 + 0x1e8),uVar8,0xffffffff,0xffffffff,
                         fchown_cb);
    puVar13 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153109;
    auStack_b08._480_8_ = (void *)0x152f76;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar13 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (fchown_cb_count != 1) goto LAB_0015310e;
    puVar6 = (uv_loop_t *)0x0;
    auStack_b08._480_8_ = (void *)0x152f9e;
    iVar3 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b08 + 0x1e8),"test_file",
                       "test_file_link",(uv_fs_cb)0x0);
    puVar13 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153113;
    puVar13 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (puStack_8c8 != (uv_loop_t *)0x0) goto LAB_00153118;
    auStack_b08._480_8_ = (void *)0x152fbd;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b08 + 0x1e8));
    puVar6 = (uv_loop_t *)0x0;
    auStack_b08._480_8_ = (void *)0x152fdc;
    iVar3 = uv_fs_lchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b08 + 0x1e8),"test_file_link",
                         0xffffffff,0xffffffff,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015311d;
    puVar11 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (puStack_8c8 != (uv_loop_t *)0x0) goto LAB_00153122;
    auStack_b08._480_8_ = (void *)0x152ffb;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b08 + 0x1e8));
    auStack_b08._480_8_ = (void *)0x153023;
    puVar6 = ::loop;
    iVar3 = uv_fs_lchown(::loop,(uv_fs_t *)(auStack_b08 + 0x1e8),"test_file_link",0xffffffff,
                         0xffffffff,lchown_cb);
    if (iVar3 != 0) goto LAB_00153127;
    auStack_b08._480_8_ = (void *)0x153039;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar12 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (lchown_cb_count != 1) goto LAB_0015312c;
    puVar6 = (uv_loop_t *)0x0;
    auStack_b08._480_8_ = (void *)0x153054;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b08 + 0x1e8),uVar8,(uv_fs_cb)0x0);
    puVar12 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153131;
    puVar12 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (puStack_8c8 != (uv_loop_t *)0x0) goto LAB_00153136;
    auStack_b08._480_8_ = (void *)0x153070;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b08 + 0x1e8));
    auStack_b08._480_8_ = (void *)0x15307e;
    uv_run(::loop,UV_RUN_DEFAULT);
    auStack_b08._480_8_ = (void *)0x15308a;
    unlink("test_file");
    auStack_b08._480_8_ = (void *)0x153096;
    unlink("test_file_link");
    auStack_b08._480_8_ = (void *)0x15309b;
    puVar9 = uv_default_loop();
    auStack_b08._480_8_ = (void *)0x1530af;
    uv_walk(puVar9,close_walk_cb,(void *)0x0);
    auStack_b08._480_8_ = (void *)0x1530b9;
    uv_run(puVar9,UV_RUN_DEFAULT);
    auStack_b08._480_8_ = (void *)0x1530be;
    puVar6 = uv_default_loop();
    auStack_b08._480_8_ = (void *)0x1530c6;
    iVar3 = uv_loop_close(puVar6);
    puVar12 = (uv_fs_t *)(auStack_b08 + 0x1e8);
    if (iVar3 == 0) {
      return 0;
    }
  }
  auStack_b08._480_8_ = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar6->backend_fd == 0x1a) {
    if (puVar6->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar6);
      return extraout_EAX_03;
    }
  }
  else {
    auStack_b08._472_8_ = (void *)0x15315f;
    chown_cb_cold_1();
  }
  auStack_b08._472_8_ = chown_root_cb;
  chown_cb_cold_2();
  auStack_b08._472_8_ = puVar9;
  if (puVar6->backend_fd == 0x1a) {
    auStack_b08._464_8_ = (void *)0x153173;
    puVar5 = puVar6;
    _Var4 = geteuid();
    pvVar7 = puVar6->watcher_queue[0];
    if (_Var4 != 0) {
      if (pvVar7 == (void *)0xffffffffffffffff) goto LAB_0015318b;
      auStack_b08._464_8_ = (void *)0x153186;
      chown_root_cb_cold_2();
    }
    puVar9 = puVar6;
    if (pvVar7 == (void *)0x0) {
LAB_0015318b:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar6);
      return extraout_EAX_04;
    }
  }
  else {
    auStack_b08._464_8_ = (void *)0x15319f;
    chown_root_cb_cold_1();
    puVar5 = puVar6;
  }
  auStack_b08._464_8_ = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar5->backend_fd == 0x1b) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return extraout_EAX_05;
    }
  }
  else {
    auStack_b08._456_8_ = (uv__io_cb)0x1531c3;
    fchown_cb_cold_1();
  }
  auStack_b08._456_8_ = lchown_cb;
  fchown_cb_cold_2();
  if (puVar5->backend_fd == 0x1e) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return extraout_EAX_06;
    }
  }
  else {
    auStack_b08._448_8_ = (_func_void *)0x1531e7;
    lchown_cb_cold_1();
  }
  auStack_b08._448_8_ = run_test_fs_link;
  lchown_cb_cold_2();
  puVar5 = (uv_loop_t *)0x194385;
  pcStackY_b20 = (code *)0x153205;
  auStack_b08._440_8_ = puVar9;
  auStack_b08._448_8_ = puVar12;
  unlink("test_file");
  pcStackY_b20 = (code *)0x153211;
  unlink("test_file_link");
  pcStackY_b20 = (code *)0x15321d;
  unlink("test_file_link2");
  pcStackY_b20 = (code *)0x153222;
  ::loop = uv_default_loop();
  loop = (char *)0x0;
  pcStackY_b20 = (code *)0x153246;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_b08,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_b08._88_8_;
  if (iVar3 < 0) {
    pcStackY_b20 = (code *)0x153584;
    run_test_fs_link_cold_1();
LAB_00153584:
    pcStackY_b20 = (code *)0x153589;
    run_test_fs_link_cold_2();
LAB_00153589:
    pcStackY_b20 = (code *)0x15358e;
    run_test_fs_link_cold_3();
LAB_0015358e:
    pcStackY_b20 = (code *)0x153593;
    run_test_fs_link_cold_4();
LAB_00153593:
    pcStackY_b20 = (code *)0x153598;
    run_test_fs_link_cold_5();
LAB_00153598:
    pcStackY_b20 = (code *)0x15359d;
    run_test_fs_link_cold_6();
LAB_0015359d:
    puVar9 = puVar5;
    pcStackY_b20 = (code *)0x1535a2;
    run_test_fs_link_cold_7();
LAB_001535a2:
    pcStackY_b20 = (code *)0x1535a7;
    run_test_fs_link_cold_8();
LAB_001535a7:
    pcStackY_b20 = (code *)0x1535ac;
    run_test_fs_link_cold_9();
LAB_001535ac:
    pcStackY_b20 = (code *)0x1535b1;
    run_test_fs_link_cold_10();
LAB_001535b1:
    pcStackY_b20 = (code *)0x1535b6;
    run_test_fs_link_cold_11();
LAB_001535b6:
    pcStackY_b20 = (code *)0x1535bb;
    run_test_fs_link_cold_12();
LAB_001535bb:
    pcStackY_b20 = (code *)0x1535c0;
    run_test_fs_link_cold_13();
LAB_001535c0:
    puVar5 = puVar9;
    pcStackY_b20 = (code *)0x1535c5;
    run_test_fs_link_cold_14();
LAB_001535c5:
    pcStackY_b20 = (code *)0x1535ca;
    run_test_fs_link_cold_15();
LAB_001535ca:
    pcStackY_b20 = (code *)0x1535cf;
    run_test_fs_link_cold_16();
LAB_001535cf:
    pcStackY_b20 = (code *)0x1535d4;
    run_test_fs_link_cold_17();
LAB_001535d4:
    pcStackY_b20 = (code *)0x1535d9;
    run_test_fs_link_cold_18();
  }
  else {
    puVar5 = (uv_loop_t *)auStack_b08._88_8_;
    if ((long)auStack_b08._88_8_ < 0) goto LAB_00153584;
    pcStackY_b20 = (code *)0x153269;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b08);
    pcStackY_b20 = (code *)0x15327a;
    uVar15 = uv_buf_init(test_buf,0xd);
    loop = (char *)0x0;
    pcStackY_b20 = (code *)0x1532b0;
    iov = uVar15;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)auStack_b08,(uv_file)uVar1,&iov,1,-1,
                        (uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)uVar1;
    if (iVar3 != 0xd) goto LAB_00153589;
    if ((uv_loop_t *)auStack_b08._88_8_ != (uv_loop_t *)0xd) goto LAB_0015358e;
    pcStackY_b20 = (code *)0x1532d2;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b08);
    pcStackY_b20 = (code *)0x1532e5;
    uv_fs_close(::loop,(uv_fs_t *)auStack_b08,(uv_file)uVar1,(uv_fs_cb)0x0);
    loop = (char *)0x0;
    pcStackY_b20 = (code *)0x153300;
    iVar3 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)auStack_b08,"test_file","test_file_link",
                       (uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00153593;
    if ((uv_loop_t *)auStack_b08._88_8_ != (uv_loop_t *)0x0) goto LAB_00153598;
    pcStackY_b20 = (code *)0x153321;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b08);
    loop = (char *)0x0;
    pcStackY_b20 = (code *)0x15333d;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_b08,"test_file_link",2,0,(uv_fs_cb)0x0);
    puVar9 = (uv_loop_t *)auStack_b08._88_8_;
    puVar5 = (uv_loop_t *)auStack_b08;
    if (iVar3 < 0) goto LAB_0015359d;
    if ((long)auStack_b08._88_8_ < 0) goto LAB_001535a2;
    pcStackY_b20 = (code *)0x153360;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b08);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_b20 = (code *)0x153382;
    uVar15 = uv_buf_init(buf,0x20);
    loop = (char *)0x0;
    pcStackY_b20 = (code *)0x1533b4;
    iov = uVar15;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_b08,(uv_file)puVar9,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_001535a7;
    if ((long)auStack_b08._88_8_ < 0) goto LAB_001535ac;
    loop = buf;
    pcStackY_b20 = (code *)0x1533db;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_001535b1;
    pcStackY_b20 = (code *)0x1533ea;
    close((uv_file)puVar9);
    pcStackY_b20 = (code *)0x153410;
    loop = (char *)::loop;
    iVar3 = uv_fs_link(::loop,(uv_fs_t *)auStack_b08,"test_file","test_file_link2",link_cb);
    if (iVar3 != 0) goto LAB_001535b6;
    pcStackY_b20 = (code *)0x153426;
    loop = (char *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (link_cb_count != 1) goto LAB_001535bb;
    loop = (char *)0x0;
    pcStackY_b20 = (code *)0x153451;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_b08,"test_file_link2",2,0,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)auStack_b08._88_8_;
    if (iVar3 < 0) goto LAB_001535c0;
    if ((long)auStack_b08._88_8_ < 0) goto LAB_001535c5;
    pcStackY_b20 = (code *)0x153474;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b08);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_b20 = (code *)0x153496;
    uVar15 = uv_buf_init(buf,0x20);
    loop = (char *)0x0;
    pcStackY_b20 = (code *)0x1534c8;
    iov = uVar15;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_b08,(uv_file)puVar5,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_001535ca;
    if ((long)auStack_b08._88_8_ < 0) goto LAB_001535cf;
    loop = buf;
    pcStackY_b20 = (code *)0x1534ef;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_001535d4;
    pcStackY_b20 = (code *)0x15350c;
    uv_fs_close(::loop,(uv_fs_t *)auStack_b08,(uv_file)puVar5,(uv_fs_cb)0x0);
    pcStackY_b20 = (code *)0x15351a;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_b20 = (code *)0x153526;
    unlink("test_file");
    pcStackY_b20 = (code *)0x153532;
    unlink("test_file_link");
    pcStackY_b20 = (code *)0x15353e;
    unlink("test_file_link2");
    pcStackY_b20 = (code *)0x153543;
    puVar5 = uv_default_loop();
    pcStackY_b20 = (code *)0x153557;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStackY_b20 = (code *)0x153561;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStackY_b20 = (code *)0x153566;
    loop = (char *)uv_default_loop();
    pcStackY_b20 = (code *)0x15356e;
    iVar3 = uv_loop_close((uv_loop_t *)loop);
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStackY_b20 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)loop)->backend_fd == 0x17) {
    if (((uv_loop_t *)loop)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)loop);
      return extraout_EAX_07;
    }
  }
  else {
    puStackY_b28 = (uv_loop_t *)0x1535fd;
    link_cb_cold_1();
  }
  puStackY_b28 = (uv_loop_t *)run_test_fs_readlink;
  link_cb_cold_2();
  puStackY_b28 = puVar5;
  ::loop = uv_default_loop();
  iVar3 = uv_fs_readlink(::loop,&uStackY_ce0,"no_such_file",dummy_cb);
  if (iVar3 == 0) {
    iVar3 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_001536f7;
    if (dummy_cb_count != 1) goto LAB_001536fc;
    if (uStackY_ce0.ptr != (void *)0x0) goto LAB_00153701;
    if (uStackY_ce0.result != -2) goto LAB_00153706;
    uv_fs_req_cleanup(&uStackY_ce0);
    iVar3 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_ce0,"no_such_file",(uv_fs_cb)0x0);
    if (iVar3 != -2) goto LAB_0015370b;
    if (uStackY_ce0.ptr != (void *)0x0) goto LAB_00153710;
    if (uStackY_ce0.result == -2) {
      uv_fs_req_cleanup(&uStackY_ce0);
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar3 = uv_loop_close(puVar5);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_0015371a;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_001536f7:
    run_test_fs_readlink_cold_2();
LAB_001536fc:
    run_test_fs_readlink_cold_3();
LAB_00153701:
    run_test_fs_readlink_cold_4();
LAB_00153706:
    run_test_fs_readlink_cold_5();
LAB_0015370b:
    run_test_fs_readlink_cold_6();
LAB_00153710:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015371a:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_08;
}

Assistant:

TEST_IMPL(fs_access) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");
  rmdir("test_dir");

  loop = uv_default_loop();

  /* File should not exist */
  r = uv_fs_access(NULL, &req, "test_file", F_OK, NULL);
  ASSERT(r < 0);
  ASSERT(req.result < 0);
  uv_fs_req_cleanup(&req);

  /* File should not exist */
  r = uv_fs_access(loop, &req, "test_file", F_OK, access_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(access_cb_count == 1);
  access_cb_count = 0; /* reset for the next test */

  /* Create file */
  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
                 S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  /* File should exist */
  r = uv_fs_access(NULL, &req, "test_file", F_OK, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* File should exist */
  r = uv_fs_access(loop, &req, "test_file", F_OK, access_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(access_cb_count == 1);
  access_cb_count = 0; /* reset for the next test */

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* Directory access */
  r = uv_fs_mkdir(NULL, &req, "test_dir", 0777, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_access(NULL, &req, "test_dir", W_OK, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  rmdir("test_dir");

  MAKE_VALGRIND_HAPPY();
  return 0;
}